

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::cp_mhl(CPU *this)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint16_t addr;
  CPU *this_local;
  
  bVar1 = this->regs->l;
  uVar3 = (uint)this->regs->h * 0x100 + (uint)bVar1;
  iVar2 = (**this->mmu->_vptr_IMmu)(this->mmu,(ulong)(ushort)uVar3,(ulong)bVar1,(ulong)uVar3);
  cp_r8(this,(uint8_t)iVar2);
  return 2;
}

Assistant:

int CPU::cp_mhl() {
    uint16_t addr = (regs.h << 8) + regs.l;
    cp_r8(mmu.read_byte(addr));
    return 2;
}